

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::complement(UnicodeSet *this,UChar32 start,UChar32 end)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  UChar32 range [3];
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    uVar2 = 0x10ffff;
    if ((uint)start < 0x10ffff) {
      uVar2 = start;
    }
    uVar1 = 0x10ffff;
    if ((uint)end < 0x10ffff) {
      uVar1 = end;
    }
    uVar3 = uVar1;
    if (end < 0) {
      uVar3 = 0;
    }
    if ((start < 0) || (uVar2 <= uVar3)) {
      if (start < 0) {
        uVar2 = 0;
      }
      range[1] = 1;
      if (-1 < end) {
        range[1] = uVar1 + 1;
      }
      range[2] = 0x110000;
      range[0] = uVar2;
      exclusiveOr(this,range,2,'\0');
    }
    releasePattern(this);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complement(UChar32 start, UChar32 end) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        exclusiveOr(range, 2, 0);
    }
    releasePattern();
    return *this;
}